

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O2

void absl::lts_20250127::base_internal::ThrowStdUnderflowError(string *what_arg)

{
  underflow_error *this;
  
  this = (underflow_error *)__cxa_allocate_exception(0x10);
  std::underflow_error::underflow_error(this,(string *)what_arg);
  __cxa_throw(this,&std::underflow_error::typeinfo,std::underflow_error::~underflow_error);
}

Assistant:

void ThrowStdUnderflowError(const std::string& what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::underflow_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg.c_str());
  std::abort();
#endif
}